

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O3

void output_c_for_amode_ptr(Token *t,BOOL reversed)

{
  char cVar1;
  ulong uVar2;
  int in_EDX;
  BOOL BVar3;
  size_t __size;
  char *pcVar4;
  ulong uVar5;
  char buf [512];
  char acStack_228 [512];
  
  cVar1 = (char)t;
  BVar3 = reversed & 7;
  uVar5 = (ulong)t & 0xff;
  switch(reversed >> 3 & 7) {
  default:
    pcVar4 = "Internal error: called output_c_for_amode_ptr with a register addressing mode!";
    goto LAB_0010dd1b;
  case 2:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)BVar3);
    return;
  case 3:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)BVar3);
    if (BVar3 == 7 || cVar1 != '\x01') {
      uVar2 = 2;
      if (cVar1 != '\x01') {
        uVar2 = uVar5;
      }
      if (BVar3 != 7) {
        uVar2 = uVar5;
      }
      pcVar4 = "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
LAB_0010dd86:
      sprintf(acStack_228,pcVar4,(ulong)BVar3,uVar2);
      goto LAB_0010dd8d;
    }
    pcVar4 = "++ADDRESS_REGISTER_UL (%d); ";
    break;
  case 4:
    uVar2 = 2;
    if (cVar1 != '\x01') {
      uVar2 = uVar5;
    }
    if (BVar3 != 7) {
      uVar2 = uVar5;
    }
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d) - %d) ",(ulong)BVar3,uVar2);
    if (BVar3 == 7 || cVar1 != '\x01') {
      pcVar4 = "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
      goto LAB_0010dd86;
    }
    pcVar4 = "--ADDRESS_REGISTER_UL (%d); ";
    break;
  case 5:
    pcVar4 = 
    "Internal error: attempting to generate code for fixed amode 5.  It should have been expanded and replaced with explicit code to compute the pointer.\n"
    ;
LAB_0010dd1b:
    fatal_error(pcVar4);
    return;
  case 6:
  case 7:
    if (in_EDX == 0) {
      pcVar4 = " (cpu_state.amode_p) ";
      __size = 0x15;
    }
    else {
      pcVar4 = " (cpu_state.reversed_amode_p) ";
      __size = 0x1e;
    }
    fwrite(pcVar4,__size,1,(FILE *)syn68k_c_stream);
    return;
  }
  sprintf(acStack_228,pcVar4,(ulong)BVar3);
LAB_0010dd8d:
  pcVar4 = strstr(c_postamble,acStack_228);
  if (pcVar4 == (char *)0x0) {
    strcat(c_postamble,acStack_228);
  }
  return;
}

Assistant:

static void
output_c_for_amode_ptr (const Token *t, BOOL reversed)
{
  int reg = t->u.amodeinfo.which & 7, mode = (t->u.amodeinfo.which >> 3) & 7;
  char buf[512];
  int size = t->u.amodeinfo.size;

  switch (mode) {
  case 0:
  case 1:
    fatal_error ("Internal error: called output_c_for_amode_ptr with "
		 "a register addressing mode!");
    break;

  case 2:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);
    break;

  case 3:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);

    /* Perform postincrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "++ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 4:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d) - %d) ", reg,
	     (reg != 7 || size != 1) ? size : 2);

    /* Perform predecrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "--ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 5:
    fatal_error ("Internal error: attempting to generate code for fixed "
		 "amode 5.  It should have been expanded and replaced with "
		 "explicit code to compute the pointer.\n");
    break;

    /* Modes 6 and 7 are too complicated to expand; a pointer to the data
     * will be placed in the appropriate place by the synthetic instruction
     * right before this one.
     */
  case 6:
  case 7:
    if (!reversed)
      fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    else
      fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;
  }
}